

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biasmultiply.cc
# Opt level: O0

duration<double,_std::ratio<1L,_1L>_>
testOld_nobias<intgemm::AVX512VNNI::Kernels8>(Index A_rows,Index width,Index B_cols)

{
  float unquant_mult_00;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *__rhs;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *__lhs;
  float *output_addr;
  undefined4 in_ESI;
  undefined4 in_EDI;
  result_type_conflict rVar1;
  time_point end;
  time_point start;
  AlignedVector<float> test_C;
  AlignedVector<signed_char> B_prep;
  AlignedVector<signed_char> A_prep;
  float unquant_mult;
  float quant_mult;
  UnquantizeAndWrite in_stack_000000a0;
  float alpha;
  float *it_1;
  float *__end1_1;
  float *__begin1_1;
  AlignedVector<float> *__range1_1;
  float *it;
  float *__end1;
  float *__begin1;
  AlignedVector<float> *__range1;
  uniform_real_distribution<float> dist;
  mt19937 gen;
  AlignedVector<float> B;
  AlignedVector<float> A;
  duration<double,_std::ratio<1L,_1L>_> elapsed_seconds;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffeb38;
  Index cols;
  uniform_real_distribution<float> *in_stack_ffffffffffffeb40;
  int8_t *in_stack_ffffffffffffeb48;
  undefined4 in_stack_ffffffffffffeb50;
  undefined4 in_stack_ffffffffffffeb54;
  UnquantizeAndWrite local_1470;
  undefined8 local_1460;
  AlignedVector<float> local_1458;
  AlignedVector<signed_char> local_1448;
  AlignedVector<signed_char> local_1438;
  float local_1424;
  undefined4 local_1420;
  undefined4 local_141c;
  float *local_1418;
  float *local_1410;
  float *local_1408;
  AlignedVector<float> *local_1400;
  float *local_13f8;
  float *local_13f0;
  float *local_13e8;
  AlignedVector<float> *local_13e0;
  Index in_stack_ffffffffffffee04;
  Index in_stack_ffffffffffffee08;
  float in_stack_ffffffffffffee0c;
  int8_t *in_stack_ffffffffffffee10;
  float *in_stack_ffffffffffffee18;
  AlignedVector<float> local_38;
  AlignedVector<float> local_28;
  undefined4 local_10;
  undefined4 local_c;
  rep_conflict local_8;
  
  local_10 = in_ESI;
  local_c = in_EDI;
  intgemm::AlignedVector<float>::AlignedVector
            ((AlignedVector<float> *)CONCAT44(in_stack_ffffffffffffeb54,in_stack_ffffffffffffeb50),
             (size_t)in_stack_ffffffffffffeb48,(size_t)in_stack_ffffffffffffeb40);
  intgemm::AlignedVector<float>::AlignedVector
            ((AlignedVector<float> *)CONCAT44(in_stack_ffffffffffffeb54,in_stack_ffffffffffffeb50),
             (size_t)in_stack_ffffffffffffeb48,(size_t)in_stack_ffffffffffffeb40);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)0x10c4fa);
  std::uniform_real_distribution<float>::uniform_real_distribution
            (in_stack_ffffffffffffeb40,(float)((ulong)in_stack_ffffffffffffeb38 >> 0x20),
             SUB84(in_stack_ffffffffffffeb38,0));
  local_13e0 = &local_28;
  local_13e8 = intgemm::AlignedVector<float>::begin(local_13e0);
  local_13f0 = intgemm::AlignedVector<float>::end(local_13e0);
  for (; local_13e8 != local_13f0; local_13e8 = local_13e8 + 1) {
    local_13f8 = local_13e8;
    rVar1 = std::uniform_real_distribution<float>::operator()
                      (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb38);
    *local_13f8 = rVar1;
  }
  local_1400 = &local_38;
  local_1408 = intgemm::AlignedVector<float>::begin(local_1400);
  local_1410 = intgemm::AlignedVector<float>::end(local_1400);
  for (; local_1408 != local_1410; local_1408 = local_1408 + 1) {
    local_1418 = local_1408;
    rVar1 = std::uniform_real_distribution<float>::operator()
                      (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb38);
    *local_1418 = rVar1;
  }
  local_141c = 0x40000000;
  local_1420 = 0x427e0000;
  local_1424 = 0.0002480005;
  intgemm::AlignedVector<float>::size(&local_28);
  cols = (Index)((ulong)in_stack_ffffffffffffeb38 >> 0x20);
  intgemm::AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)
             CONCAT44(in_stack_ffffffffffffeb54,in_stack_ffffffffffffeb50),
             (size_t)in_stack_ffffffffffffeb48,(size_t)in_stack_ffffffffffffeb40);
  intgemm::AlignedVector<float>::size(&local_38);
  intgemm::AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)
             CONCAT44(in_stack_ffffffffffffeb54,in_stack_ffffffffffffeb50),
             (size_t)in_stack_ffffffffffffeb48,(size_t)in_stack_ffffffffffffeb40);
  intgemm::AlignedVector<float>::begin(&local_28);
  intgemm::AlignedVector<signed_char>::begin(&local_1438);
  intgemm::AVX512BW::Kernels8::PrepareA
            ((float *)CONCAT44(in_stack_ffffffffffffeb54,in_stack_ffffffffffffeb50),
             in_stack_ffffffffffffeb48,(float)((ulong)in_stack_ffffffffffffeb40 >> 0x20),
             (Index)in_stack_ffffffffffffeb40,cols);
  intgemm::AlignedVector<float>::begin(&local_38);
  intgemm::AlignedVector<signed_char>::begin(&local_1448);
  intgemm::AVX512BW::Kernels8::PrepareB
            (in_stack_ffffffffffffee18,in_stack_ffffffffffffee10,in_stack_ffffffffffffee0c,
             in_stack_ffffffffffffee08,in_stack_ffffffffffffee04);
  intgemm::AlignedVector<float>::AlignedVector
            ((AlignedVector<float> *)CONCAT44(in_stack_ffffffffffffeb54,in_stack_ffffffffffffeb50),
             (size_t)in_stack_ffffffffffffeb48,(size_t)in_stack_ffffffffffffeb40);
  local_1460 = std::chrono::_V2::system_clock::now();
  __rhs = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
           *)intgemm::AlignedVector<signed_char>::begin(&local_1438);
  __lhs = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
           *)intgemm::AlignedVector<signed_char>::begin(&local_1448);
  unquant_mult_00 = local_1424;
  output_addr = intgemm::AlignedVector<float>::begin(&local_1458);
  intgemm::callbacks::UnquantizeAndWrite::UnquantizeAndWrite
            (&local_1470,unquant_mult_00,output_addr);
  intgemm::AVX512VNNI::Kernels8::Multiply<intgemm::callbacks::UnquantizeAndWrite>
            ((int8_t *)A_prep.size_,A_prep.mem_,B_prep.size_._4_4_,(Index)B_prep.size_,
             B_prep.mem_._4_4_,in_stack_000000a0);
  std::chrono::_V2::system_clock::now();
  std::chrono::operator-(__lhs,__rhs);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)CONCAT44(local_10,local_c),&__lhs->__d);
  intgemm::AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x10c8c0);
  intgemm::AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x10c8cd);
  intgemm::AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x10c8da);
  intgemm::AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x10c8e7);
  intgemm::AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x10c8f4);
  return (duration<double,_std::ratio<1L,_1L>_>)local_8;
}

Assistant:

std::chrono::duration<double> testOld_nobias(Index A_rows, Index width, Index B_cols) {
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }

  float alpha = 2.0f;
  float quant_mult = 127.0f / alpha;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<int8_t> A_prep(A.size());
  AlignedVector<int8_t> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);

  auto start = std::chrono::system_clock::now();
  Routine::Multiply(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndWrite(unquant_mult, test_C.begin()));
  auto end = std::chrono::system_clock::now();

  std::chrono::duration<double> elapsed_seconds = end-start;
  return elapsed_seconds;

}